

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O0

char * lws_sql_purify(char *escaped,char *string,size_t len)

{
  char *pcVar1;
  char *local_30;
  char *q;
  char *p;
  size_t len_local;
  char *string_local;
  char *escaped_local;
  
  local_30 = escaped;
  q = string;
  p = (char *)len;
  while( true ) {
    pcVar1 = p;
    if (*q != '\0') {
      p = p + -1;
    }
    if (*q == '\0' || pcVar1 < (char *)0x3) break;
    if (*q == '\'') {
      *local_30 = '\'';
      local_30[1] = '\'';
      p = p + -1;
      local_30 = local_30 + 2;
    }
    else {
      *local_30 = *q;
      local_30 = local_30 + 1;
    }
    q = q + 1;
  }
  *local_30 = '\0';
  return escaped;
}

Assistant:

const char *
lws_sql_purify(char *escaped, const char *string, size_t len)
{
	const char *p = string;
	char *q = escaped;

	while (*p && len-- > 2) {
		if (*p == '\'') {
			*q++ = '\'';
			*q++ = '\'';
			len --;
			p++;
		} else
			*q++ = *p++;
	}
	*q = '\0';

	return escaped;
}